

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O3

ImFont ** ImVector_ImFontPtr_insert(ImVector_ImFontPtr *self,ImFont **it,ImFont *v)

{
  int iVar1;
  int iVar2;
  ImFont **__dest;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  __dest = self->Data;
  if (__dest <= it) {
    iVar1 = self->Size;
    lVar3 = (long)iVar1;
    if (it <= __dest + lVar3) {
      lVar5 = (long)it - (long)__dest;
      if (iVar1 == self->Capacity) {
        if (iVar1 == 0) {
          iVar2 = 8;
        }
        else {
          iVar2 = iVar1 / 2 + iVar1;
        }
        iVar6 = iVar1 + 1;
        if (iVar1 + 1 < iVar2) {
          iVar6 = iVar2;
        }
        __dest = (ImFont **)ImGui::MemAlloc((long)iVar6 << 3);
        if (self->Data != (ImFont **)0x0) {
          memcpy(__dest,self->Data,(long)self->Size << 3);
          ImGui::MemFree(self->Data);
        }
        self->Data = __dest;
        self->Capacity = iVar6;
        lVar3 = (long)self->Size;
      }
      lVar4 = lVar3 - (lVar5 >> 3);
      if (lVar4 != 0 && lVar5 >> 3 <= lVar3) {
        memmove((void *)((long)__dest + lVar5 + 8),(void *)((long)__dest + lVar5),lVar4 * 8);
        __dest = self->Data;
      }
      *(ImFont **)((long)__dest + lVar5) = v;
      self->Size = self->Size + 1;
      return (ImFont **)(lVar5 + (long)self->Data);
    }
  }
  __assert_fail("it >= Data && it <= Data+Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                ,0x4f2,"T *ImVector<ImFont *>::insert(const T *, const T &) [T = ImFont *]");
}

Assistant:

CIMGUI_API int igGetFrameCount()
{
    return ImGui::GetFrameCount();
}